

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<Node> * __thiscall vector<Node>::operator=(vector<Node> *this,vector<Node> *other)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  Node *pNVar4;
  Node *local_48;
  int local_28 [2];
  int i;
  vector<Node> *local_18;
  vector<Node> *other_local;
  vector<Node> *this_local;
  
  this->_size = other->_size;
  this->_capacity = other->_capacity;
  uVar2 = (ulong)this->_capacity;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_18 = other;
  other_local = this;
  pNVar4 = (Node *)operator_new__(uVar3);
  if (uVar2 != 0) {
    local_48 = pNVar4;
    do {
      Node::Node(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pNVar4 + uVar2);
  }
  this->vect = pNVar4;
  for (local_28[0] = 0; local_28[0] < this->_size; local_28[0] = local_28[0] + 1) {
    pNVar4 = operator[](local_18,local_28);
    Node::operator=(this->vect + local_28[0],pNVar4);
  }
  return this;
}

Assistant:

vector &operator = (const vector &other) {
        _size = other._size;
        _capacity = other._capacity;
        vect = new T[_capacity]();

        for (int i = 0; i < _size; ++i) {
            vect[i] = other[i];
        }

        return *this;
    }